

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildBr(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *pSVar1;
  code *pcVar2;
  uint32 uVar3;
  bool bVar4;
  OpCode OVar5;
  uint uVar6;
  undefined4 *puVar7;
  bool local_45;
  Pair<unsigned_int,_bool,_DefaultComparer> local_44;
  bool local_39;
  Pair<unsigned_int,_bool,_DefaultComparer> local_38;
  byte local_2d;
  uint32 local_2c;
  bool isLongBranchIsland;
  OpLayoutBr *pOStack_28;
  uint targetOffset;
  OpLayoutBr *branchInsn;
  BranchInstr *branchInstr;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  branchInstr._0_4_ = offset;
  branchInstr._6_2_ = newOpcode;
  _offset_local = this;
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1c98,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOStack_28 = Js::ByteCodeReader::Br(&this->m_jnReader);
  uVar6 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  local_2c = uVar6 + (int)pOStack_28->RelativeJumpOffset;
  OVar5 = Js::ByteCodeReader::PeekOp(&this->m_jnReader);
  local_2d = OVar5 == BrLong;
  if ((bool)local_2d) {
    ConsumeBranchIsland(this);
  }
  if (branchInstr._6_2_ == EndSwitch) {
    SwitchIRBuilder::EndSwitch(&this->m_switchBuilder,(uint32)branchInstr,local_2c);
  }
  else {
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PerfHintPhase);
    if ((bVar4) && ((branchInstr._6_2_ == TryCatch || (branchInstr._6_2_ == TryFinally)))) {
      WritePerfHint(HasTryBlock,this->m_func,(uint32)branchInstr);
    }
    uVar3 = local_2c;
    if (((local_2d & 1) != 0) &&
       (uVar6 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader), uVar3 == uVar6)) {
      if (this->m_offsetToInstructionCount <= (uint32)branchInstr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1cb8,"(offset < m_offsetToInstructionCount)",
                           "offset < m_offsetToInstructionCount");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (this->m_offsetToInstruction[(uint32)branchInstr] == (Instr *)0x0) {
        this->m_offsetToInstruction[(uint32)branchInstr] = (Instr *)&DAT_ffffffffffffffff;
        JsUtil::
        BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Add(this->longBranchMap,(uint *)&branchInstr,&local_2c);
        return;
      }
      if ((this->m_offsetToInstruction[(uint32)branchInstr]->m_opcode != StatementBoundary) &&
         ((bVar4 = Js::ConfigFlagsTable::IsEnabled
                             ((ConfigFlagsTable *)&Js::Configuration::Global,
                              BailOutAtEveryByteCodeFlag), !bVar4 ||
          (this->m_offsetToInstruction[(uint32)branchInstr]->m_opcode != BailOnEqual)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1cc9,
                           "(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual))"
                           ,
                           "m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual)"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    if ((branchInstr._6_2_ == TryCatch) &&
       (this->handlerOffsetStack !=
        (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)0x0)) {
      pSVar1 = this->handlerOffsetStack;
      local_39 = true;
      JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Pair(&local_38,&local_2c,&local_39);
      SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>::
      Push(pSVar1,&local_38);
    }
    else if ((branchInstr._6_2_ == TryFinally) &&
            (this->handlerOffsetStack !=
             (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
              *)0x0)) {
      pSVar1 = this->handlerOffsetStack;
      local_45 = false;
      JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>::Pair(&local_44,&local_2c,&local_45);
      SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>::
      Push(pSVar1,&local_44);
    }
    branchInsn = (OpLayoutBr *)
                 IR::BranchInstr::New(branchInstr._6_2_,(LabelInstr *)0x0,this->m_func);
    AddBranchInstr(this,(BranchInstr *)branchInsn,(uint32)branchInstr,local_2c);
  }
  return;
}

Assistant:

void
IRBuilder::BuildBr(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::BranchInstr * branchInstr;
    const unaligned   Js::OpLayoutBr *branchInsn = m_jnReader.Br();
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
#ifdef BYTECODE_BRANCH_ISLAND
    bool isLongBranchIsland = (m_jnReader.PeekOp() == Js::OpCode::BrLong);
    if (isLongBranchIsland)
    {
        ConsumeBranchIsland();
    }
#endif

    if(newOpcode == Js::OpCode::EndSwitch)
    {
        m_switchBuilder.EndSwitch(offset, targetOffset);
        return;
    }
#ifdef PERF_HINT
    else if (PHASE_TRACE1(Js::PerfHintPhase) && (newOpcode == Js::OpCode::TryCatch || newOpcode == Js::OpCode::TryFinally) )
    {
        WritePerfHint(PerfHints::HasTryBlock, this->m_func, offset);
    }
#endif

#ifdef BYTECODE_BRANCH_ISLAND
    if (isLongBranchIsland && (targetOffset == (uint)m_jnReader.GetCurrentOffset()))
    {
        // Branch to next (probably after consume branch island), try to not emit the branch

        // Mark the jump around instruction as a virtual long branch as well so we can just
        // fall through instead of branch to exit
        Assert(offset < m_offsetToInstructionCount);
        if (m_offsetToInstruction[offset] == nullptr)
        {
            m_offsetToInstruction[offset] = VirtualLongBranchInstr;
            longBranchMap->Add(offset, targetOffset);
            return;
        }

        // We may have already create an instruction on this offset as a statement boundary
        // or in the bailout at every byte code case.

        // The statement boundary case only happens if we have emitted the long branch island
        // after an existing no fall through instruction, but that instruction also happen to be
        // branch to next.  We will just generate an actual branch to next instruction.

        Assert(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary
            || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
            && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual));
    }
#endif

    if ((newOpcode == Js::OpCode::TryCatch) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, true));
    }
    else if ((newOpcode == Js::OpCode::TryFinally) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, false));
    }
    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}